

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

int lws_raw_transaction_completed(lws *wsi)

{
  int iVar1;
  lws_log_cx *cx;
  lws *wsi_local;
  
  iVar1 = lws_has_buffered_out(wsi);
  if (iVar1 == 0) {
    wsi_local._4_4_ = -1;
  }
  else {
    cx = lwsl_wsi_get_cx(wsi);
    _lws_log_cx(cx,lws_log_prepend_wsi,wsi,0x10,"lws_raw_transaction_completed",
                "deferring due to partial");
    *(ulong *)&wsi->field_0x46e = *(ulong *)&wsi->field_0x46e & 0xffffffefffffffff | 0x1000000000;
    lws_callback_on_writable(wsi);
    wsi_local._4_4_ = 0;
  }
  return wsi_local._4_4_;
}

Assistant:

int LWS_WARN_UNUSED_RESULT
lws_raw_transaction_completed(struct lws *wsi)
{
	if (lws_has_buffered_out(wsi)) {
		/*
		 * ...so he tried to send something large, but it went out
		 * as a partial, but he immediately called us to say he wants
		 * to close the connection.
		 *
		 * Defer the close until the last part of the partial is sent.
		 *
		 */

		lwsl_wsi_debug(wsi, "deferring due to partial");
		wsi->close_when_buffered_out_drained = 1;
		lws_callback_on_writable(wsi);

		return 0;
	}

	return -1;
}